

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk88(envy_bios *bios)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  envy_bios_power_unk88_entry *peVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  uVar6 = (bios->power).unk88.offset;
  iVar9 = -0x16;
  if ((ulong)uVar6 != 0) {
    if (uVar6 < bios->length) {
      (bios->power).unk88.version = bios->data[uVar6];
    }
    else {
      (bios->power).unk88.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).unk88.version == '\x10') {
      uVar6 = (bios->power).unk88.offset + 1;
      if (uVar6 < bios->length) {
        (bios->power).unk88.hlen = bios->data[uVar6];
        iVar9 = 0;
      }
      else {
        (bios->power).unk88.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar9 = -0xe;
      }
      uVar6 = (bios->power).unk88.offset + 2;
      if (uVar6 < bios->length) {
        (bios->power).unk88.rlen = bios->data[uVar6];
        iVar7 = 0;
      }
      else {
        (bios->power).unk88.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      uVar6 = (bios->power).unk88.offset + 3;
      if (uVar6 < bios->length) {
        (bios->power).unk88.entriesnum = bios->data[uVar6];
        iVar3 = 0;
      }
      else {
        (bios->power).unk88.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar3 = -0xe;
      }
      (bios->power).unk88.valid = (iVar7 == 0 && iVar9 == 0) && iVar3 == 0;
      bVar1 = (bios->power).unk88.entriesnum;
      peVar4 = (envy_bios_power_unk88_entry *)malloc((ulong)((uint)bVar1 * 4));
      (bios->power).unk88.entries = peVar4;
      if (bVar1 == 0) {
        iVar9 = 0;
      }
      else {
        uVar5 = (uint)(bios->power).unk88.hlen + (bios->power).unk88.offset;
        bVar2 = (bios->power).unk88.rlen;
        iVar9 = 0;
        uVar8 = 0;
        do {
          peVar4[uVar8].offset = uVar5;
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 + bVar2;
        } while (bVar1 != uVar8);
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER DI table version 0x%x\n");
    }
  }
  return iVar9;
}

Assistant:

int envy_bios_parse_power_unk88(struct envy_bios *bios) {
	struct envy_bios_power_unk88 *unk88 = &bios->power.unk88;
	int i, err = 0;

	if (!unk88->offset)
		return -EINVAL;

	bios_u8(bios, unk88->offset + 0x0, &unk88->version);
	switch(unk88->version) {
	case 0x10:
		err |= bios_u8(bios, unk88->offset + 0x1, &unk88->hlen);
		err |= bios_u8(bios, unk88->offset + 0x2, &unk88->rlen);
		err |= bios_u8(bios, unk88->offset + 0x3, &unk88->entriesnum);
		unk88->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER DI table version 0x%x\n", unk88->version);
		return -EINVAL;
	};

	err = 0;
	unk88->entries = malloc(unk88->entriesnum * sizeof(struct envy_bios_power_unk88_entry));
	for (i = 0; i < unk88->entriesnum; i++) {
		uint32_t data = unk88->offset + unk88->hlen + i * unk88->rlen;

		unk88->entries[i].offset = data;
	}

	return 0;
}